

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void __thiscall Display::run(Display *this)

{
  element_type *peVar1;
  int key;
  runtime_error *this_00;
  
  if (this->exit == false) {
    do {
      peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"OMG io is NULL");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (*peVar1->_vptr_IODevice[7])(peVar1,0);
      calculateStates(this);
      renderBoard(this);
      renderStatusline(this);
      updateCursor(this);
      key = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IODevice[2])();
      handleKey(this,key);
    } while (this->exit != true);
  }
  return;
}

Assistant:

void Display::run() {
    while(!exit) {
        // rendering process
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
        io->setCursorVisibility(0);
        calculateStates();
        renderBoard();
        renderStatusline();
        updateCursor();
        handleKey(getKey());
    }
}